

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O2

Cell * array_new<Lib::Set<Kernel::Variable,Lib::StlHash>::Cell>(void *placement,size_t length)

{
  Cell *this;
  bool bVar1;
  
  this = (Cell *)placement;
  while (bVar1 = length != 0, length = length - 1, bVar1) {
    Lib::Set<Kernel::Variable,_Lib::StlHash>::Cell::Cell(this);
    this = this + 1;
  }
  return (Cell *)placement;
}

Assistant:

T* array_new(void* placement, size_t length)
{
  ASS_NEQ(placement,0);
  ASS_G(length,0);

  T* res=static_cast<T*>(placement);
  T* p=res;
  while(length--) {
    ::new(static_cast<void*>(p++)) T();
  }
  return res;
}